

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShaderResourceVariableBase.hpp
# Opt level: O0

void __thiscall
Diligent::
ShaderVariableBase<Diligent::ShaderVariableManagerGL::TextureBindInfo,_Diligent::ShaderVariableManagerGL,_Diligent::IShaderResourceVariable>
::CheckResources(ShaderVariableBase<Diligent::ShaderVariableManagerGL::TextureBindInfo,_Diligent::ShaderVariableManagerGL,_Diligent::IShaderResourceVariable>
                 *this,IResourceMapping *pResourceMapping,BIND_SHADER_RESOURCES_FLAGS Flags,
                SHADER_RESOURCE_VARIABLE_TYPE_FLAGS *StaleVarTypes)

{
  SHADER_RESOURCE_VARIABLE_TYPE_FLAGS b;
  SHADER_RESOURCE_VARIABLE_TYPE_FLAGS SVar1;
  BIND_SHADER_RESOURCES_FLAGS BVar2;
  int iVar3;
  PipelineResourceDesc *pPVar4;
  IDeviceObject *pIVar5;
  undefined4 extraout_var;
  IDeviceObject *pObj;
  IDeviceObject *pBoundObj;
  Uint32 ArrInd;
  SHADER_RESOURCE_VARIABLE_TYPE_FLAGS VarTypeFlag;
  PipelineResourceDesc *ResDesc;
  TextureBindInfo *pThis;
  SHADER_RESOURCE_VARIABLE_TYPE_FLAGS *StaleVarTypes_local;
  BIND_SHADER_RESOURCES_FLAGS Flags_local;
  IResourceMapping *pResourceMapping_local;
  ShaderVariableBase<Diligent::ShaderVariableManagerGL::TextureBindInfo,_Diligent::ShaderVariableManagerGL,_Diligent::IShaderResourceVariable>
  *this_local;
  
  pPVar4 = GetDesc(this);
  b = 1 << (pPVar4->VarType & 0x1f);
  if (((Flags & b) != SHADER_RESOURCE_VARIABLE_TYPE_FLAG_NONE) &&
     (SVar1 = Diligent::operator&(*StaleVarTypes,b),
     SVar1 == SHADER_RESOURCE_VARIABLE_TYPE_FLAG_NONE)) {
    for (pBoundObj._0_4_ = 0; (uint)pBoundObj < pPVar4->ArraySize;
        pBoundObj._0_4_ = (uint)pBoundObj + 1) {
      pIVar5 = ShaderVariableManagerGL::TextureBindInfo::Get
                         ((TextureBindInfo *)this,(uint)pBoundObj);
      if ((pIVar5 == (IDeviceObject *)0x0) ||
         (BVar2 = Diligent::operator&(Flags,BIND_SHADER_RESOURCES_KEEP_EXISTING), BVar2 == 0)) {
        if ((pIVar5 == (IDeviceObject *)0x0) &&
           (BVar2 = Diligent::operator&(Flags,BIND_SHADER_RESOURCES_VERIFY_ALL_RESOLVED), BVar2 != 0
           )) {
          operator|=(StaleVarTypes,b);
          return;
        }
        if (pResourceMapping != (IResourceMapping *)0x0) {
          iVar3 = (*(pResourceMapping->super_IObject)._vptr_IObject[7])
                            (pResourceMapping,pPVar4->Name,(ulong)(uint)pBoundObj);
          if (((IDeviceObject *)CONCAT44(extraout_var,iVar3) != (IDeviceObject *)0x0) &&
             ((IDeviceObject *)CONCAT44(extraout_var,iVar3) != pIVar5)) {
            operator|=(StaleVarTypes,b);
            return;
          }
        }
      }
    }
  }
  return;
}

Assistant:

void CheckResources(IResourceMapping* pResourceMapping, BIND_SHADER_RESOURCES_FLAGS Flags, SHADER_RESOURCE_VARIABLE_TYPE_FLAGS& StaleVarTypes) const
    {
        const ThisImplType* const   pThis   = static_cast<const ThisImplType*>(this);
        const PipelineResourceDesc& ResDesc = pThis->GetDesc();

        const SHADER_RESOURCE_VARIABLE_TYPE_FLAGS VarTypeFlag = static_cast<SHADER_RESOURCE_VARIABLE_TYPE_FLAGS>(1u << ResDesc.VarType);
        if ((Flags & VarTypeFlag) == 0)
            return; // This variable type is not being processed

        if ((StaleVarTypes & VarTypeFlag) != 0)
            return; // This variable type is already stale

        for (Uint32 ArrInd = 0; ArrInd < ResDesc.ArraySize; ++ArrInd)
        {
            const IDeviceObject* const pBoundObj = pThis->Get(ArrInd);
            if ((pBoundObj != nullptr) && (Flags & BIND_SHADER_RESOURCES_KEEP_EXISTING) != 0)
                continue;

            if ((pBoundObj == nullptr) && (Flags & BIND_SHADER_RESOURCES_VERIFY_ALL_RESOLVED) != 0)
            {
                StaleVarTypes |= VarTypeFlag;
                return;
            }

            if (pResourceMapping != nullptr)
            {
                if (IDeviceObject* pObj = pResourceMapping->GetResource(ResDesc.Name, ArrInd))
                {
                    if (pObj != pBoundObj)
                    {
                        StaleVarTypes |= VarTypeFlag;
                        return;
                    }
                }
            }
        }
    }